

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O1

int decompress8(DUMBFILE *f,char *data,int len,int it215,int stereo)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int in_EAX;
  int iVar29;
  uint uVar30;
  int iVar31;
  int extraout_EAX;
  int extraout_EAX_00;
  long lVar32;
  char cVar33;
  char cVar34;
  uint uVar35;
  long lVar36;
  byte bVar37;
  uint uVar38;
  uint bitwidth;
  ulong uVar39;
  char *pcVar40;
  char cVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int iVar63;
  int iVar66;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar80;
  int iVar84;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  readblock_crap crap;
  char *local_80;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar28 = _DAT_00771ac0;
  auVar27 = _DAT_00771ab0;
  auVar26 = _DAT_00771aa0;
  auVar25 = _DAT_00771a90;
  auVar24 = _DAT_00771a80;
  auVar23 = _DAT_00771a70;
  auVar22 = _DAT_007140f0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  if (0 < len) {
    in_EAX = stereo + 1;
    lVar32 = (long)in_EAX;
    lVar36 = (ulong)(uint)len - 1;
    auVar43._8_4_ = (int)lVar36;
    auVar43._0_8_ = lVar36;
    auVar43._12_4_ = (int)((ulong)lVar36 >> 0x20);
    uVar39 = 0;
    pcVar40 = data;
    do {
      auVar61._8_4_ = (int)uVar39;
      auVar61._0_8_ = uVar39;
      auVar61._12_4_ = (int)(uVar39 >> 0x20);
      auVar64 = auVar43 ^ auVar22;
      auVar67 = (auVar61 | auVar28) ^ auVar22;
      iVar63 = auVar64._0_4_;
      iVar80 = -(uint)(iVar63 < auVar67._0_4_);
      iVar66 = auVar64._4_4_;
      auVar69._4_4_ = -(uint)(iVar66 < auVar67._4_4_);
      iVar31 = auVar64._8_4_;
      iVar84 = -(uint)(iVar31 < auVar67._8_4_);
      iVar29 = auVar64._12_4_;
      auVar69._12_4_ = -(uint)(iVar29 < auVar67._12_4_);
      auVar44._4_4_ = iVar80;
      auVar44._0_4_ = iVar80;
      auVar44._8_4_ = iVar84;
      auVar44._12_4_ = iVar84;
      auVar44 = pshuflw(in_XMM1,auVar44,0xe8);
      auVar68._4_4_ = -(uint)(auVar67._4_4_ == iVar66);
      auVar68._12_4_ = -(uint)(auVar67._12_4_ == iVar29);
      auVar68._0_4_ = auVar68._4_4_;
      auVar68._8_4_ = auVar68._12_4_;
      auVar53 = pshuflw(in_XMM2,auVar68,0xe8);
      auVar69._0_4_ = auVar69._4_4_;
      auVar69._8_4_ = auVar69._12_4_;
      auVar67 = pshuflw(auVar44,auVar69,0xe8);
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar64 = (auVar67 | auVar53 & auVar44) ^ auVar64;
      auVar64 = packssdw(auVar64,auVar64);
      if ((auVar64 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *pcVar40 = '\0';
      }
      auVar53._4_4_ = iVar80;
      auVar53._0_4_ = iVar80;
      auVar53._8_4_ = iVar84;
      auVar53._12_4_ = iVar84;
      auVar69 = auVar68 & auVar53 | auVar69;
      auVar64 = packssdw(auVar69,auVar69);
      auVar67._8_4_ = 0xffffffff;
      auVar67._0_8_ = 0xffffffffffffffff;
      auVar67._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 ^ auVar67,auVar64 ^ auVar67);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._0_4_ >> 8 & 1) != 0) {
        pcVar40[lVar32] = '\0';
      }
      auVar64 = (auVar61 | auVar27) ^ auVar22;
      auVar54._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar54._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar54._8_4_ = -(uint)(iVar31 < auVar64._8_4_);
      auVar54._12_4_ = -(uint)(iVar29 < auVar64._12_4_);
      auVar70._4_4_ = auVar54._0_4_;
      auVar70._0_4_ = auVar54._0_4_;
      auVar70._8_4_ = auVar54._8_4_;
      auVar70._12_4_ = auVar54._8_4_;
      iVar80 = -(uint)(auVar64._4_4_ == iVar66);
      iVar84 = -(uint)(auVar64._12_4_ == iVar29);
      auVar10._4_4_ = iVar80;
      auVar10._0_4_ = iVar80;
      auVar10._8_4_ = iVar84;
      auVar10._12_4_ = iVar84;
      auVar81._4_4_ = auVar54._4_4_;
      auVar81._0_4_ = auVar54._4_4_;
      auVar81._8_4_ = auVar54._12_4_;
      auVar81._12_4_ = auVar54._12_4_;
      auVar64 = auVar10 & auVar70 | auVar81;
      auVar64 = packssdw(auVar64,auVar64);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 ^ auVar1,auVar64 ^ auVar1);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._0_4_ >> 0x10 & 1) != 0) {
        pcVar40[lVar32 * 2] = '\0';
      }
      auVar64 = pshufhw(auVar64,auVar70,0x84);
      auVar11._4_4_ = iVar80;
      auVar11._0_4_ = iVar80;
      auVar11._8_4_ = iVar84;
      auVar11._12_4_ = iVar84;
      auVar67 = pshufhw(auVar54,auVar11,0x84);
      auVar44 = pshufhw(auVar64,auVar81,0x84);
      auVar45._8_4_ = 0xffffffff;
      auVar45._0_8_ = 0xffffffffffffffff;
      auVar45._12_4_ = 0xffffffff;
      auVar45 = (auVar44 | auVar67 & auVar64) ^ auVar45;
      auVar64 = packssdw(auVar45,auVar45);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._0_4_ >> 0x18 & 1) != 0) {
        pcVar40[lVar32 * 3] = '\0';
      }
      auVar64 = (auVar61 | auVar26) ^ auVar22;
      auVar55._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar55._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar55._8_4_ = -(uint)(iVar31 < auVar64._8_4_);
      auVar55._12_4_ = -(uint)(iVar29 < auVar64._12_4_);
      auVar12._4_4_ = auVar55._0_4_;
      auVar12._0_4_ = auVar55._0_4_;
      auVar12._8_4_ = auVar55._8_4_;
      auVar12._12_4_ = auVar55._8_4_;
      auVar67 = pshuflw(auVar81,auVar12,0xe8);
      auVar46._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
      auVar46._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
      auVar46._8_4_ = -(uint)(auVar64._8_4_ == iVar31);
      auVar46._12_4_ = -(uint)(auVar64._12_4_ == iVar29);
      auVar71._4_4_ = auVar46._4_4_;
      auVar71._0_4_ = auVar46._4_4_;
      auVar71._8_4_ = auVar46._12_4_;
      auVar71._12_4_ = auVar46._12_4_;
      auVar64 = pshuflw(auVar46,auVar71,0xe8);
      auVar72._4_4_ = auVar55._4_4_;
      auVar72._0_4_ = auVar55._4_4_;
      auVar72._8_4_ = auVar55._12_4_;
      auVar72._12_4_ = auVar55._12_4_;
      auVar44 = pshuflw(auVar55,auVar72,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 & auVar67,(auVar44 | auVar64 & auVar67) ^ auVar2);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar40[lVar32 * 4] = '\0';
      }
      auVar13._4_4_ = auVar55._0_4_;
      auVar13._0_4_ = auVar55._0_4_;
      auVar13._8_4_ = auVar55._8_4_;
      auVar13._12_4_ = auVar55._8_4_;
      auVar72 = auVar71 & auVar13 | auVar72;
      auVar44 = packssdw(auVar72,auVar72);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64,auVar44 ^ auVar3);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._4_2_ >> 8 & 1) != 0) {
        pcVar40[lVar32 * 5] = '\0';
      }
      auVar64 = (auVar61 | auVar25) ^ auVar22;
      auVar56._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar56._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar56._8_4_ = -(uint)(iVar31 < auVar64._8_4_);
      auVar56._12_4_ = -(uint)(iVar29 < auVar64._12_4_);
      auVar73._4_4_ = auVar56._0_4_;
      auVar73._0_4_ = auVar56._0_4_;
      auVar73._8_4_ = auVar56._8_4_;
      auVar73._12_4_ = auVar56._8_4_;
      iVar80 = -(uint)(auVar64._4_4_ == iVar66);
      iVar84 = -(uint)(auVar64._12_4_ == iVar29);
      auVar14._4_4_ = iVar80;
      auVar14._0_4_ = iVar80;
      auVar14._8_4_ = iVar84;
      auVar14._12_4_ = iVar84;
      auVar82._4_4_ = auVar56._4_4_;
      auVar82._0_4_ = auVar56._4_4_;
      auVar82._8_4_ = auVar56._12_4_;
      auVar82._12_4_ = auVar56._12_4_;
      auVar64 = auVar14 & auVar73 | auVar82;
      auVar64 = packssdw(auVar64,auVar64);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 ^ auVar4,auVar64 ^ auVar4);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar40[lVar32 * 6] = '\0';
      }
      auVar64 = pshufhw(auVar64,auVar73,0x84);
      auVar15._4_4_ = iVar80;
      auVar15._0_4_ = iVar80;
      auVar15._8_4_ = iVar84;
      auVar15._12_4_ = iVar84;
      auVar67 = pshufhw(auVar56,auVar15,0x84);
      auVar44 = pshufhw(auVar64,auVar82,0x84);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar47 = (auVar44 | auVar67 & auVar64) ^ auVar47;
      auVar64 = packssdw(auVar47,auVar47);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._6_2_ >> 8 & 1) != 0) {
        pcVar40[lVar32 * 7] = '\0';
      }
      auVar64 = (auVar61 | auVar24) ^ auVar22;
      auVar57._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar57._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar57._8_4_ = -(uint)(iVar31 < auVar64._8_4_);
      auVar57._12_4_ = -(uint)(iVar29 < auVar64._12_4_);
      auVar16._4_4_ = auVar57._0_4_;
      auVar16._0_4_ = auVar57._0_4_;
      auVar16._8_4_ = auVar57._8_4_;
      auVar16._12_4_ = auVar57._8_4_;
      auVar67 = pshuflw(auVar82,auVar16,0xe8);
      auVar48._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
      auVar48._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
      auVar48._8_4_ = -(uint)(auVar64._8_4_ == iVar31);
      auVar48._12_4_ = -(uint)(auVar64._12_4_ == iVar29);
      auVar74._4_4_ = auVar48._4_4_;
      auVar74._0_4_ = auVar48._4_4_;
      auVar74._8_4_ = auVar48._12_4_;
      auVar74._12_4_ = auVar48._12_4_;
      auVar64 = pshuflw(auVar48,auVar74,0xe8);
      auVar75._4_4_ = auVar57._4_4_;
      auVar75._0_4_ = auVar57._4_4_;
      auVar75._8_4_ = auVar57._12_4_;
      auVar75._12_4_ = auVar57._12_4_;
      auVar44 = pshuflw(auVar57,auVar75,0xe8);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar58 = (auVar44 | auVar64 & auVar67) ^ auVar58;
      auVar44 = packssdw(auVar58,auVar58);
      auVar64 = packsswb(auVar64 & auVar67,auVar44);
      if ((auVar64 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar40[lVar32 * 8] = '\0';
      }
      auVar17._4_4_ = auVar57._0_4_;
      auVar17._0_4_ = auVar57._0_4_;
      auVar17._8_4_ = auVar57._8_4_;
      auVar17._12_4_ = auVar57._8_4_;
      auVar75 = auVar74 & auVar17 | auVar75;
      auVar44 = packssdw(auVar75,auVar75);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar44 = packssdw(auVar44 ^ auVar5,auVar44 ^ auVar5);
      auVar64 = packsswb(auVar64,auVar44);
      if ((auVar64._8_2_ >> 8 & 1) != 0) {
        pcVar40[lVar32 * 9] = '\0';
      }
      auVar64 = (auVar61 | auVar23) ^ auVar22;
      auVar59._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar59._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar59._8_4_ = -(uint)(iVar31 < auVar64._8_4_);
      auVar59._12_4_ = -(uint)(iVar29 < auVar64._12_4_);
      auVar76._4_4_ = auVar59._0_4_;
      auVar76._0_4_ = auVar59._0_4_;
      auVar76._8_4_ = auVar59._8_4_;
      auVar76._12_4_ = auVar59._8_4_;
      iVar80 = -(uint)(auVar64._4_4_ == iVar66);
      iVar84 = -(uint)(auVar64._12_4_ == iVar29);
      auVar18._4_4_ = iVar80;
      auVar18._0_4_ = iVar80;
      auVar18._8_4_ = iVar84;
      auVar18._12_4_ = iVar84;
      auVar83._4_4_ = auVar59._4_4_;
      auVar83._0_4_ = auVar59._4_4_;
      auVar83._8_4_ = auVar59._12_4_;
      auVar83._12_4_ = auVar59._12_4_;
      auVar64 = auVar18 & auVar76 | auVar83;
      auVar64 = packssdw(auVar64,auVar64);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 ^ auVar6,auVar64 ^ auVar6);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pcVar40[lVar32 * 10] = '\0';
      }
      auVar64 = pshufhw(auVar64,auVar76,0x84);
      auVar19._4_4_ = iVar80;
      auVar19._0_4_ = iVar80;
      auVar19._8_4_ = iVar84;
      auVar19._12_4_ = iVar84;
      auVar67 = pshufhw(auVar59,auVar19,0x84);
      auVar44 = pshufhw(auVar64,auVar83,0x84);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar44 | auVar67 & auVar64) ^ auVar49;
      auVar64 = packssdw(auVar49,auVar49);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._10_2_ >> 8 & 1) != 0) {
        pcVar40[lVar32 * 0xb] = '\0';
      }
      auVar64 = (auVar61 | _DAT_00771a60) ^ auVar22;
      auVar60._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar60._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar60._8_4_ = -(uint)(iVar31 < auVar64._8_4_);
      auVar60._12_4_ = -(uint)(iVar29 < auVar64._12_4_);
      auVar20._4_4_ = auVar60._0_4_;
      auVar20._0_4_ = auVar60._0_4_;
      auVar20._8_4_ = auVar60._8_4_;
      auVar20._12_4_ = auVar60._8_4_;
      auVar67 = pshuflw(auVar83,auVar20,0xe8);
      auVar50._0_4_ = -(uint)(auVar64._0_4_ == iVar63);
      auVar50._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
      auVar50._8_4_ = -(uint)(auVar64._8_4_ == iVar31);
      auVar50._12_4_ = -(uint)(auVar64._12_4_ == iVar29);
      auVar77._4_4_ = auVar50._4_4_;
      auVar77._0_4_ = auVar50._4_4_;
      auVar77._8_4_ = auVar50._12_4_;
      auVar77._12_4_ = auVar50._12_4_;
      auVar64 = pshuflw(auVar50,auVar77,0xe8);
      auVar78._4_4_ = auVar60._4_4_;
      auVar78._0_4_ = auVar60._4_4_;
      auVar78._8_4_ = auVar60._12_4_;
      auVar78._12_4_ = auVar60._12_4_;
      auVar44 = pshuflw(auVar60,auVar78,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 & auVar67,(auVar44 | auVar64 & auVar67) ^ auVar7);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar40[lVar32 * 0xc] = '\0';
      }
      auVar21._4_4_ = auVar60._0_4_;
      auVar21._0_4_ = auVar60._0_4_;
      auVar21._8_4_ = auVar60._8_4_;
      auVar21._12_4_ = auVar60._8_4_;
      auVar78 = auVar77 & auVar21 | auVar78;
      auVar44 = packssdw(auVar78,auVar78);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64,auVar44 ^ auVar8);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64._12_2_ >> 8 & 1) != 0) {
        pcVar40[lVar32 * 0xd] = '\0';
      }
      auVar64 = (auVar61 | _DAT_00771a50) ^ auVar22;
      auVar51._0_4_ = -(uint)(iVar63 < auVar64._0_4_);
      auVar51._4_4_ = -(uint)(iVar66 < auVar64._4_4_);
      auVar51._8_4_ = -(uint)(iVar31 < auVar64._8_4_);
      auVar51._12_4_ = -(uint)(iVar29 < auVar64._12_4_);
      auVar79._4_4_ = auVar51._0_4_;
      auVar79._0_4_ = auVar51._0_4_;
      auVar79._8_4_ = auVar51._8_4_;
      auVar79._12_4_ = auVar51._8_4_;
      auVar62._4_4_ = -(uint)(auVar64._4_4_ == iVar66);
      auVar62._12_4_ = -(uint)(auVar64._12_4_ == iVar29);
      auVar62._0_4_ = auVar62._4_4_;
      auVar62._8_4_ = auVar62._12_4_;
      auVar65._4_4_ = auVar51._4_4_;
      auVar65._0_4_ = auVar51._4_4_;
      auVar65._8_4_ = auVar51._12_4_;
      auVar65._12_4_ = auVar51._12_4_;
      auVar44 = auVar62 & auVar79 | auVar65;
      auVar64 = packssdw(auVar51,auVar44);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar64 = packssdw(auVar64 ^ auVar9,auVar64 ^ auVar9);
      auVar64 = packsswb(auVar64,auVar64);
      if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar40[lVar32 * 0xe] = '\0';
      }
      auVar64 = pshufhw(auVar64,auVar79,0x84);
      auVar44 = pshufhw(auVar44,auVar62,0x84);
      in_XMM2 = auVar44 & auVar64;
      auVar64 = pshufhw(auVar64,auVar65,0x84);
      auVar52._8_4_ = 0xffffffff;
      auVar52._0_8_ = 0xffffffffffffffff;
      auVar52._12_4_ = 0xffffffff;
      auVar52 = (auVar64 | in_XMM2) ^ auVar52;
      auVar64 = packssdw(auVar52,auVar52);
      in_XMM1 = packsswb(auVar64,auVar64);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        pcVar40[lVar32 * 0xf] = '\0';
      }
      uVar39 = uVar39 + 0x10;
      pcVar40 = pcVar40 + lVar32 * 0x10;
    } while ((len + 0xfU & 0xfffffff0) != uVar39);
  }
  if (0 < len) {
    local_80 = data;
    while (in_EAX = readblock(f,(readblock_crap *)local_58), in_EAX == 0) {
      iVar63 = 0x8000;
      if (len < 0x8000) {
        iVar63 = len;
      }
      iVar66 = 1;
      if (1 < iVar63) {
        iVar66 = iVar63;
      }
      iVar29 = len - iVar66;
      cVar34 = '\0';
      uVar38 = 9;
      bVar42 = true;
      cVar41 = '\0';
      iVar80 = 0;
      iVar31 = len;
      do {
        while( true ) {
          bVar37 = (byte)uVar38;
          bitwidth = uVar38 & 0xff;
          uVar30 = readbits(bitwidth,(readblock_crap *)local_58);
          if (6 < bVar37) break;
          if ((uVar30 & 0xffff) == 1 << (bVar37 - 1 & 0x1f)) {
            iVar84 = readbits(3,(readblock_crap *)local_58);
            uVar38 = iVar84 + (uint)(bitwidth <= (iVar84 + 1U & 0xffff)) + 1;
            goto LAB_006f5319;
          }
LAB_006f5325:
          if (bVar37 < 8) {
            cVar33 = (char)((int)(char)(uVar30 << (8 - bVar37 & 0x1f)) >> (8 - bVar37 & 0x1f));
          }
          else {
            cVar33 = (char)uVar30;
          }
          cVar41 = cVar41 + cVar33;
          cVar34 = cVar34 + cVar41;
          cVar33 = cVar34;
          if (it215 == 0) {
            cVar33 = cVar41;
          }
          *local_80 = cVar33;
          local_80 = local_80 + (ulong)(uint)stereo + 1;
          iVar31 = iVar31 + -1;
          iVar80 = iVar80 + 1;
          bVar42 = iVar80 < iVar63;
          len = iVar29;
          if (iVar80 == iVar66) goto LAB_006f539d;
        }
        if (8 < bVar37) {
          if (bVar37 != 9) {
            free((void *)local_58._0_8_);
            return extraout_EAX_00;
          }
          if ((uVar30 >> 8 & 1) != 0) {
            uVar38 = uVar30 + 1;
            goto LAB_006f5319;
          }
          goto LAB_006f5325;
        }
        uVar35 = (0xffU >> (9 - bVar37 & 0x1f)) + 0xfc & 0xff;
        if (uVar35 + 8 < (uVar30 & 0xffff) || (uVar30 & 0xffff) <= uVar35) goto LAB_006f5325;
        uVar38 = (uint)(bitwidth <= (uVar30 - uVar35 & 0xffff)) + (uVar30 - uVar35);
LAB_006f5319:
        len = iVar31;
      } while (bVar42);
LAB_006f539d:
      free((void *)local_58._0_8_);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_58._8_8_;
      local_58 = auVar22 << 0x40;
      if (len < 1) {
        return extraout_EAX;
      }
    }
  }
  return in_EAX;
}

Assistant:

static int decompress8(DUMBFILE *f, signed char *data, int len, int it215, int stereo)
{
	int blocklen, blockpos;
	byte bitwidth;
	word val;
	char d1, d2;
	readblock_crap crap;

	memset(&crap, 0, sizeof(crap));

	for (blocklen = 0, blockpos = 0; blocklen < len; blocklen++, blockpos += 1 + stereo)
		data[ blockpos ] = 0;

	while (len > 0) {
		//Read a block of compressed data:
		if (readblock(f, &crap))
			return -1;
		//Set up a few variables
		blocklen = (len < 0x8000) ? len : 0x8000; //Max block length is 0x8000 bytes
		blockpos = 0;
		bitwidth = 9;
		d1 = d2 = 0;
		//Start the decompression:
		while (blockpos < blocklen) {
			//Read a value:
			val = (word)readbits(bitwidth, &crap);
			//Check for bit width change:

			if (bitwidth < 7) { //Method 1:
				if (val == (1 << (bitwidth - 1))) {
					val = (word)readbits(3, &crap) + 1;
					bitwidth = (val < bitwidth) ? val : val + 1;
					continue;
				}
			}
			else if (bitwidth < 9) { //Method 2
				byte border = (0xFF >> (9 - bitwidth)) - 4;

				if (val > border && val <= (border + 8)) {
					val -= border;
					bitwidth = (val < bitwidth) ? val : val + 1;
					continue;
				}
			}
			else if (bitwidth == 9) { //Method 3
				if (val & 0x100) {
					bitwidth = (val + 1) & 0xFF;
					continue;
				}
			}
			else { //Illegal width, abort ?
				freeblock(&crap);
				return -1;
			}

			//Expand the value to signed byte:
			{
				char v; //The sample value:
				if (bitwidth < 8) {
					byte shift = 8 - bitwidth;
					v = (val << shift);
					v >>= shift;
				}
				else
					v = (char)val;

				//And integrate the sample value
				//(It always has to end with integration doesn't it ? ;-)
				d1 += v;
				d2 += d1;
			}

			//Store !
			/* Version 2.15 was an unofficial version with hacked compression
			 * code. Yay, better compression :D
			 */
			*data++ = it215 ? d2 : d1;
			data += stereo;
			len--;
			blockpos++;
		}
		freeblock(&crap);
	}
	return 0;
}